

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_cleanup_multiple_channels_in_vector(APITests *this)

{
  byte bVar1;
  runtime_error *this_00;
  Warning *in_RDI;
  vector<int,_std::allocator<int>_> channels;
  Warning w;
  Warning *in_stack_fffffffffffffdd8;
  string local_200 [8];
  allocator_type *in_stack_fffffffffffffe08;
  Warning *in_stack_fffffffffffffe10;
  initializer_list<int> in_stack_fffffffffffffe18;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 *local_1d0;
  undefined8 local_1c8;
  vector local_1c0 [448];
  
  GPIO::setwarnings(false);
  Warning::Warning(in_stack_fffffffffffffe10);
  GPIO::setmode(BOARD);
  GPIO::setup(*(int *)&in_RDI->field_0x24,IN,-1);
  GPIO::setup(*(int *)&in_RDI->field_0x2c,IN,-1);
  GPIO::setup(*(int *)&in_RDI->field_0x20,OUT,-1);
  local_1d8 = *(undefined4 *)&in_RDI->field_0x24;
  local_1d4 = *(undefined4 *)&in_RDI->field_0x2c;
  local_1d0 = &local_1d8;
  local_1c8 = 2;
  std::allocator<int>::allocator((allocator<int> *)0x139d2f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe08);
  std::allocator<int>::~allocator((allocator<int> *)0x139d54);
  GPIO::cleanup(local_1c0);
  Warning::contents_abi_cxx11_(in_stack_fffffffffffffdd8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_200);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    GPIO::cleanup();
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
    Warning::~Warning(in_RDI);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected warning occured");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_cleanup_multiple_channels_in_vector()
    {
        GPIO::setwarnings(false);
        Warning w{};

        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::setup(pin_data.in_b, GPIO::IN);
        GPIO::setup(pin_data.out_a, GPIO::OUT);

        std::vector<int> channels = {pin_data.in_a, pin_data.in_b};
        GPIO::cleanup(channels);

        if (!w.contents().empty())
            throw std::runtime_error("Unexpected warning occured");

        GPIO::cleanup();
    }